

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.h
# Opt level: O2

command_node * __thiscall libchars::command_cursor::current(command_cursor *this)

{
  _Elt_pointer ppcVar1;
  command_node **ppcVar2;
  
  ppcVar1 = (this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppcVar1 ==
      (this->S).c.
      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>._M_impl
      .super__Deque_impl_data._M_start._M_cur) {
    ppcVar2 = &this->root;
  }
  else {
    if (ppcVar1 ==
        (this->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppcVar1 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppcVar2 = ppcVar1 + -1;
  }
  return *ppcVar2;
}

Assistant:

inline command_node *current() const { return S.empty() ? root : S.top(); }